

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O2

void __thiscall OpenMD::Integrator::~Integrator(Integrator *this)

{
  Rattle *this_00;
  DumpWriter *this_01;
  StatWriter *this_02;
  
  this->_vptr_Integrator = (_func_int **)&PTR__Integrator_002bd3e8;
  if (this->forceMan_ != (ForceManager *)0x0) {
    (*this->forceMan_->_vptr_ForceManager[1])();
  }
  if (this->flucQ_ != (FluctuatingChargePropagator *)0x0) {
    (*this->flucQ_->_vptr_FluctuatingChargePropagator[1])();
  }
  if (this->rotAlgo_ != (RotationAlgorithm *)0x0) {
    (*this->rotAlgo_->_vptr_RotationAlgorithm[1])();
  }
  this_00 = this->rattle_;
  if (this_00 != (Rattle *)0x0) {
    Rattle::~Rattle(this_00);
  }
  operator_delete(this_00,0x68);
  this_01 = this->dumpWriter;
  if (this_01 != (DumpWriter *)0x0) {
    DumpWriter::~DumpWriter(this_01);
  }
  operator_delete(this_01,0x60);
  if (this->stats != (Stats *)0x0) {
    (*this->stats->_vptr_Stats[1])();
  }
  this_02 = this->statWriter;
  if (this_02 != (StatWriter *)0x0) {
    StatWriter::~StatWriter(this_02);
  }
  operator_delete(this_02,0x448);
  std::unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>::~unique_ptr
            (&this->progressBar);
  std::unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>::~unique_ptr
            (&this->rnemd_);
  std::unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::~unique_ptr
            (&this->velocitizer_);
  return;
}

Assistant:

Integrator::~Integrator() {
    delete forceMan_;
    delete flucQ_;
    delete rotAlgo_;
    delete rattle_;
    delete dumpWriter;
    delete stats;
    delete statWriter;
  }